

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QString * __thiscall
QAccessibleLineEdit::text(QAccessibleLineEdit *this,int startOffset,int endOffset)

{
  EchoMode EVar1;
  int in_ECX;
  int in_EDX;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  QLineEdit *this_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ECX < in_EDX) {
    QString::QString((QString *)0x7f0c73);
    this_00 = in_RDI;
  }
  else {
    this_00 = in_RDI;
    lineEdit((QAccessibleLineEdit *)0x7f0c7f);
    EVar1 = QLineEdit::echoMode(in_RDI);
    if (EVar1 == Normal) {
      lineEdit((QAccessibleLineEdit *)0x7f0ca2);
      QLineEdit::text(this_00);
      QString::mid((longlong)in_RDI,(longlong)local_20);
      QString::~QString((QString *)0x7f0cd8);
    }
    else {
      QString::QString((QString *)0x7f0c96);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleLineEdit::text(int startOffset, int endOffset) const
{
    if (startOffset > endOffset)
        return QString();

    if (lineEdit()->echoMode() != QLineEdit::Normal)
        return QString();

    return lineEdit()->text().mid(startOffset, endOffset - startOffset);
}